

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O2

void __thiscall
google::protobuf::EnumDescriptorProto::EnumDescriptorProto(EnumDescriptorProto *this,Arena *arena)

{
  (this->super_Message).super_MessageLite._internal_metadata_.ptr_ = (intptr_t)arena;
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__EnumDescriptorProto_00440460;
  *(int *)((long)&this->field_0 + 0x10) = 0;
  *(int *)((long)&this->field_0 + 0x14) = 0;
  *(undefined8 *)&this->field_0 = 0;
  (this->field_0)._impl_.value_.super_RepeatedPtrFieldBase.tagged_rep_or_elem_ = (void *)0x0;
  (this->field_0)._impl_.value_.super_RepeatedPtrFieldBase.arena_ = arena;
  (this->field_0)._impl_.reserved_range_.super_RepeatedPtrFieldBase.tagged_rep_or_elem_ =
       (void *)0x0;
  *(int *)((long)&this->field_0 + 0x28) = 0;
  *(int *)((long)&this->field_0 + 0x2c) = 0;
  (this->field_0)._impl_.reserved_range_.super_RepeatedPtrFieldBase.arena_ = arena;
  (this->field_0)._impl_.reserved_name_.super_RepeatedPtrFieldBase.tagged_rep_or_elem_ = (void *)0x0
  ;
  *(int *)((long)&this->field_0 + 0x40) = 0;
  *(int *)((long)&this->field_0 + 0x44) = 0;
  (this->field_0)._impl_.reserved_name_.super_RepeatedPtrFieldBase.arena_ = arena;
  (this->field_0)._impl_.name_.tagged_ptr_.ptr_ = &internal::fixed_address_empty_string;
  (this->field_0)._impl_.options_ = (EnumOptions *)0x0;
  (this->field_0)._impl_.visibility_ = 0;
  return;
}

Assistant:

explicit InternalMetadata(Arena* arena) {
    ptr_ = reinterpret_cast<intptr_t>(arena);
  }